

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10ValidPolicyMappingTest6Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::Section10ValidPolicyMappingTest6Subpart2
          (Section10ValidPolicyMappingTest6Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section10ValidPolicyMappingTest6Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  PkitsTest10PolicyMappings<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::
  PkitsTest10PolicyMappings
            (&this->
              super_PkitsTest10PolicyMappings<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
            );
  (this->
  super_PkitsTest10PolicyMappings<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  ).super_PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>.super_Test
  ._vptr_Test = (_func_int **)&PTR__Section10ValidPolicyMappingTest6Subpart2_0093fa68;
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10ValidPolicyMappingTest6Subpart2) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "P1Mapping1to234CACert",
      "P1Mapping1to234subCACert", "ValidPolicyMappingTest6EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "P1Mapping1to234CACRL",
                              "P1Mapping1to234subCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.6";
  info.should_validate = false;
  info.SetInitialPolicySet("NIST-test-policy-6");
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}